

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveIn::in<myEmployeeBoss>
          (ChArchiveIn *this,ChNameValue<std::shared_ptr<myEmployeeBoss>_> *bVal)

{
  bool bVar1;
  int iVar2;
  char *mname;
  char *pcVar3;
  undefined4 extraout_var;
  shared_ptr<myEmployeeBoss> *psVar5;
  mapped_type *pmVar6;
  myEmployeeBoss **local_f8;
  shared_ptr<myEmployeeBoss> local_f0;
  shared_ptr<myEmployeeBoss> local_e0;
  myEmployeeBoss **local_d0;
  shared_ptr<myEmployeeBoss> local_c8;
  _Node_iterator_base<std::pair<void_*const,_std::shared_ptr<void>_>,_false> local_b8;
  myEmployeeBoss **local_b0;
  _Node_iterator_base<std::pair<void_*const,_std::shared_ptr<void>_>,_false> local_a8;
  myEmployeeBoss **local_a0;
  shared_ptr<myEmployeeBoss> local_98;
  shared_ptr<myEmployeeBoss> local_88;
  ChNameValue<chrono::ChFunctorArchiveIn> local_78;
  long local_60;
  void *newptr;
  undefined1 local_48 [8];
  ChNameValue<chrono::ChFunctorArchiveIn> mtmp;
  ChFunctorArchiveInSpecificPtr<myEmployeeBoss> specFuncA;
  myEmployeeBoss *mptr;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> *bVal_local;
  ChArchiveIn *this_local;
  long lVar4;
  
  ChFunctorArchiveInSpecificPtr<myEmployeeBoss>::ChFunctorArchiveInSpecificPtr
            ((ChFunctorArchiveInSpecificPtr<myEmployeeBoss> *)&mtmp._flags,
             (myEmployeeBoss **)&specFuncA.pt2Object);
  mname = ChNameValue<std::shared_ptr<myEmployeeBoss>_>::name(bVal);
  pcVar3 = ChNameValue<std::shared_ptr<myEmployeeBoss>_>::flags(bVal);
  ChNameValue<chrono::ChFunctorArchiveIn>::ChNameValue
            ((ChNameValue<chrono::ChFunctorArchiveIn> *)local_48,mname,
             (ChFunctorArchiveIn *)&mtmp._flags,*pcVar3);
  ChNameValue<chrono::ChFunctorArchiveIn>::ChNameValue
            (&local_78,(ChNameValue<chrono::ChFunctorArchiveIn> *)local_48);
  iVar2 = (*(this->super_ChArchive)._vptr_ChArchive[0xd])(this,&local_78);
  lVar4 = CONCAT44(extraout_var,iVar2);
  ChNameValue<chrono::ChFunctorArchiveIn>::~ChNameValue(&local_78);
  local_60 = lVar4;
  if (lVar4 == 0) {
    local_b0 = specFuncA.pt2Object;
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<void_*,_std::shared_ptr<void>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>_>
         ::find(&this->shared_ptr_map,&local_b0);
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<void_*,_std::shared_ptr<void>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>_>
         ::end(&this->shared_ptr_map);
    bVar1 = std::__detail::operator!=(&local_a8,&local_b8);
    if (bVar1) {
      local_d0 = specFuncA.pt2Object;
      std::
      unordered_map<void_*,_std::shared_ptr<void>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>_>
      ::operator[](&this->shared_ptr_map,&local_d0);
      std::static_pointer_cast<myEmployeeBoss,void>((shared_ptr<void> *)&local_c8);
      psVar5 = ChNameValue<std::shared_ptr<myEmployeeBoss>_>::value(bVal);
      std::shared_ptr<myEmployeeBoss>::operator=(psVar5,&local_c8);
      std::shared_ptr<myEmployeeBoss>::~shared_ptr(&local_c8);
    }
    else {
      std::shared_ptr<myEmployeeBoss>::shared_ptr<myEmployeeBoss,void>
                (&local_e0,(myEmployeeBoss *)specFuncA.pt2Object);
      psVar5 = ChNameValue<std::shared_ptr<myEmployeeBoss>_>::value(bVal);
      std::shared_ptr<myEmployeeBoss>::operator=(psVar5,&local_e0);
      std::shared_ptr<myEmployeeBoss>::~shared_ptr(&local_e0);
      ChNameValue<std::shared_ptr<myEmployeeBoss>_>::value(bVal);
      std::static_pointer_cast<void,myEmployeeBoss>(&local_f0);
      local_f8 = specFuncA.pt2Object;
      pmVar6 = std::
               unordered_map<void_*,_std::shared_ptr<void>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>_>
               ::operator[](&this->shared_ptr_map,&local_f8);
      std::shared_ptr<void>::operator=(pmVar6,(shared_ptr<void> *)&local_f0);
      std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&local_f0);
    }
  }
  else {
    std::shared_ptr<myEmployeeBoss>::shared_ptr<myEmployeeBoss,void>
              (&local_88,(myEmployeeBoss *)specFuncA.pt2Object);
    psVar5 = ChNameValue<std::shared_ptr<myEmployeeBoss>_>::value(bVal);
    std::shared_ptr<myEmployeeBoss>::operator=(psVar5,&local_88);
    std::shared_ptr<myEmployeeBoss>::~shared_ptr(&local_88);
    ChNameValue<std::shared_ptr<myEmployeeBoss>_>::value(bVal);
    std::static_pointer_cast<void,myEmployeeBoss>(&local_98);
    local_a0 = specFuncA.pt2Object;
    pmVar6 = std::
             unordered_map<void_*,_std::shared_ptr<void>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>_>
             ::operator[](&this->shared_ptr_map,&local_a0);
    std::shared_ptr<void>::operator=(pmVar6,(shared_ptr<void> *)&local_98);
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&local_98);
  }
  ChNameValue<chrono::ChFunctorArchiveIn>::~ChNameValue
            ((ChNameValue<chrono::ChFunctorArchiveIn> *)local_48);
  ChFunctorArchiveInSpecificPtr<myEmployeeBoss>::~ChFunctorArchiveInSpecificPtr
            ((ChFunctorArchiveInSpecificPtr<myEmployeeBoss> *)&mtmp._flags);
  return;
}

Assistant:

void in     (ChNameValue< std::shared_ptr<T> > bVal) {
          T* mptr;
          ChFunctorArchiveInSpecificPtr<T> specFuncA(&mptr);
          ChNameValue<ChFunctorArchiveIn> mtmp(bVal.name(), specFuncA, bVal.flags());
          void* newptr = this->in_ref(mtmp);

          // Some additional complication respect to raw pointers: 
          // it must properly increment shared count of shared pointers.
          if(newptr) {
              // case A: new object, so just make a shared ptr with initial count=1
              bVal.value() = std::shared_ptr<T> ( mptr ); 
              this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
          }
          else {
              if (this->shared_ptr_map.find(mptr) != this->shared_ptr_map.end()) {
                  // case B1: preexisting object, previously referenced by a shared ptr, so increment ref count
                  bVal.value() = std::static_pointer_cast<T>(shared_ptr_map[mptr]);
              }
              else {
                  // case B2: preexisting object, but not referenced by shared ptr (maybe by some raw ptr) so just make a shared ptr with initial count=1
                  bVal.value() = std::shared_ptr<T> ( mptr ); 
                  this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
              }
          }
      }